

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar20;
  pointer pMVar14;
  pointer pMVar15;
  int *piVar16;
  void *pvVar17;
  Allocator *pAVar18;
  size_t sVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  bool bVar30;
  bool bVar31;
  byte bVar32;
  int iVar33;
  Layer *pLVar34;
  _func_int **pp_Var35;
  long lVar36;
  byte bVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  byte bVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  undefined1 (*pauVar46) [64];
  ulong uVar47;
  undefined1 (*pauVar48) [64];
  int k;
  uint uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  undefined1 (*pauVar54) [32];
  uint uVar55;
  uint uVar56;
  long lVar57;
  undefined1 (*pauVar58) [16];
  int iVar59;
  undefined1 (*pauVar60) [16];
  _func_int **pp_Var61;
  long lVar62;
  _func_int **pp_Var63;
  _func_int **pp_Var64;
  int iVar65;
  uint uVar66;
  long lVar67;
  int iVar68;
  uint uVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  undefined8 uVar73;
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  ulong local_390;
  uint local_378;
  ulong local_368;
  uint local_360;
  uint local_35c;
  long local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  ulong local_338;
  undefined8 local_330;
  ParamDict pd;
  Allocator *local_308;
  int iStack_300;
  int iStack_2fc;
  undefined8 uStack_2f8;
  int local_2f0 [2];
  size_t local_2e8;
  void *local_2e0;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  size_t sStack_2d0;
  int iStack_2c8;
  Allocator *local_2c0;
  undefined1 local_2b8 [16];
  int local_2a8;
  size_t local_2a0;
  long local_298;
  long local_290;
  ParamDict pd_5;
  size_t local_278;
  Allocator *local_268;
  int iStack_25c;
  undefined1 local_260 [16];
  int local_250;
  size_t local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  int TILE_M;
  long local_1f8;
  long local_1f0;
  uint local_1e4;
  uint local_1e0;
  int TILE_K;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  Mat *local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  long local_40;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar34 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  case 2:
    pLVar34 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  case 3:
    pLVar34 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  case 4:
    pLVar34 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  case 5:
    pLVar34 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  case 6:
    pLVar34 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar34->_vptr_Layer[2])(pLVar34);
    break;
  default:
    pLVar34 = (Layer *)0x0;
    goto LAB_00180328;
  }
  ParamDict::~ParamDict(&pd);
LAB_00180328:
  if (pLVar34 != (Layer *)0x0) {
    (*pLVar34->_vptr_Layer[4])(pLVar34);
  }
  this->activation = pLVar34;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar13 = (this->super_Convolution).kernel_w;
  uVar20 = (this->super_Convolution).kernel_h;
  auVar98._4_4_ = uVar20;
  auVar98._0_4_ = uVar13;
  uVar47 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar20 * uVar13);
  uVar56 = (this->super_Convolution).num_output;
  uVar47 = (long)((ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) /
           (long)(int)uVar56;
  iVar59 = (int)uVar47;
  if (uVar13 == uVar20 && opt->use_packing_layout == false) {
    auVar23._0_4_ = (this->super_Convolution).dilation_w;
    auVar23._4_4_ = (this->super_Convolution).dilation_h;
    auVar23._8_4_ = (this->super_Convolution).stride_w;
    auVar23._12_4_ = (this->super_Convolution).stride_h;
    auVar99._4_4_ = auVar23._0_4_;
    auVar99._0_4_ = auVar23._0_4_;
    auVar99._8_4_ = auVar23._0_4_;
    auVar99._12_4_ = auVar23._0_4_;
    auVar101._8_4_ = 1;
    auVar101._0_8_ = 0x100000001;
    auVar101._12_4_ = 1;
    auVar99 = vpblendd_avx2(auVar101,auVar99,2);
    uVar41 = vpcmpd_avx512vl(auVar23,auVar99,4);
    uVar44 = vpcmpeqd_avx512vl(auVar23,auVar99);
    auVar23 = vpmovm2d_avx512vl(uVar41 & 0xf);
    auVar99 = vpmovm2d_avx512vl(uVar44 & 0xf);
    auVar23 = vpblendd_avx2(auVar99,auVar23,1);
    uVar73 = vpmovd2m_avx512vl(auVar23);
    if ((~(ushort)uVar73 & 0xf) == 0) {
      pLVar34 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar34;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_2e8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_308 = (Allocator *)0x0;
        iStack_300 = 0;
        iStack_2fc = 0;
        uStack_2f8._0_4_ = 0;
        uStack_2f8._4_4_ = 0;
        local_2f0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar16 = (this->super_Convolution).weight_data.refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar16 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar16,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
          local_308 = (this->super_Convolution).weight_data.allocator;
          uVar26 = (this->super_Convolution).weight_data.dims;
          uVar27 = (this->super_Convolution).weight_data.w;
          uStack_2f8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_2f8._4_4_ = (this->super_Convolution).weight_data.d;
          local_2f0[0] = (this->super_Convolution).weight_data.c;
          local_2e8 = (this->super_Convolution).weight_data.cstep;
          iStack_300 = uVar26;
          iStack_2fc = uVar27;
        }
        pLVar34 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar34->_vptr_Layer[3])(pLVar34,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar16 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_308 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_308->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar36 = 0x40;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar36) = 0;
          *(undefined1 (*) [16])((long)&local_368 + lVar36) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_35c + lVar36) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_348 + lVar36) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_340 + lVar36 + 4) = (undefined1  [16])0x0;
          lVar36 = lVar36 + 0x48;
        } while (lVar36 != 0xd0);
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar16 = (this->super_Convolution).weight_data.refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_308 == (Allocator *)0x0) {
                if (pd._vptr_ParamDict != (_func_int **)0x0) {
                  free(pd._vptr_ParamDict);
                }
              }
              else {
                (*local_308->_vptr_Allocator[3])();
              }
            }
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar16 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar16,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
          local_308 = (this->super_Convolution).weight_data.allocator;
          uVar24 = (this->super_Convolution).weight_data.dims;
          uVar25 = (this->super_Convolution).weight_data.w;
          uStack_2f8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_2f8._4_4_ = (this->super_Convolution).weight_data.d;
          local_2f0[0] = (this->super_Convolution).weight_data.c;
          local_2e8 = (this->super_Convolution).weight_data.cstep;
          iStack_300 = uVar24;
          iStack_2fc = uVar25;
        }
        if ((Mat *)&local_2e0 != &(this->super_Convolution).bias_data) {
          piVar16 = (this->super_Convolution).bias_data.refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = (int *)CONCAT44(uStack_2d4,uStack_2d8);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_2c0 == (Allocator *)0x0) {
                if (local_2e0 != (void *)0x0) {
                  free(local_2e0);
                }
              }
              else {
                (*local_2c0->_vptr_Allocator[3])();
              }
            }
          }
          local_2e0 = (this->super_Convolution).bias_data.data;
          piVar16 = (this->super_Convolution).bias_data.refcount;
          uStack_2d8 = SUB84(piVar16,0);
          uStack_2d4 = (undefined4)((ulong)piVar16 >> 0x20);
          sStack_2d0 = (this->super_Convolution).bias_data.elemsize;
          iStack_2c8 = (this->super_Convolution).bias_data.elempack;
          local_2c0 = (this->super_Convolution).bias_data.allocator;
          local_2b8._0_4_ = (this->super_Convolution).bias_data.dims;
          local_2b8._4_4_ = (this->super_Convolution).bias_data.w;
          local_2b8._8_4_ = (this->super_Convolution).bias_data.h;
          local_2b8._12_4_ = (this->super_Convolution).bias_data.d;
          local_2a8 = (this->super_Convolution).bias_data.c;
          local_2a0 = (this->super_Convolution).bias_data.cstep;
        }
        pLVar34 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar34->_vptr_Layer[3])(pLVar34,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar36 = 0x48;
        do {
          piVar16 = *(int **)((long)&pd.d + lVar36);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              pvVar17 = *(void **)((long)&pd._vptr_ParamDict + lVar36);
              if (*(long **)((long)&local_308 + lVar36) == (long *)0x0) {
                if (pvVar17 != (void *)0x0) {
                  free(pvVar17);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_308 + lVar36) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_2e8 + lVar36) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar36 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar36) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_300 + lVar36) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_2f0 + lVar36) = 0;
          lVar36 = lVar36 + -0x48;
        } while (lVar36 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar16 = (this->super_Convolution).weight_data.refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            pvVar17 = (this->super_Convolution).weight_data.data;
            pAVar18 = (this->super_Convolution).weight_data.allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar17 != (void *)0x0) {
                free(pvVar17);
              }
            }
            else {
              (*pAVar18->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar43 = 1;
  iVar68 = 1;
  if (opt->use_packing_layout != false) {
    iVar68 = 0x10;
    uVar43 = 0x10;
    if ((uVar47 & 0xf) != 0) {
      if ((uVar47 & 7) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (uint)((uVar47 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar56 & 0xf) != 0) {
      if ((uVar56 & 7) == 0) {
        iVar68 = 8;
      }
      else {
        iVar68 = (uint)((uVar56 & 3) == 0) * 3 + 1;
      }
    }
  }
  bVar42 = opt->use_winograd23_convolution;
  if ((((bool)bVar42 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar30 = false;
  }
  else {
    bVar30 = 8 < (int)uVar56 || 8 < iVar59;
  }
  auVar21._0_4_ = (this->super_Convolution).dilation_w;
  auVar21._4_4_ = (this->super_Convolution).dilation_h;
  auVar21._8_4_ = (this->super_Convolution).stride_w;
  auVar21._12_4_ = (this->super_Convolution).stride_h;
  auVar98._8_8_ = 0;
  auVar98 = vpunpcklqdq_avx(auVar98,auVar21);
  if (((auVar98 == _DAT_005f2800) && ((this->super_Convolution).stride_w == 1)) &&
     (((this->super_Convolution).stride_h == 1 &&
      ((opt->use_winograd_convolution != false && (bVar30)))))) {
    pMVar14 = (this->super_Convolution).super_Layer.bottom_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((((pMVar14 ==
           (this->super_Convolution).super_Layer.bottom_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_finish) || (pMVar14->w == 0)) || (pMVar14->h == 0)) &&
       (((pMVar15 = (this->super_Convolution).super_Layer.top_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start,
         pMVar15 ==
         (this->super_Convolution).super_Layer.top_shapes.
         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
         _M_finish || (pMVar15->w == 0)) || (pMVar15->h == 0)))) {
      if ((((int)uVar56 < 0x21) && (opt->use_winograd63_convolution != false)) && (iVar59 < 0x21)) {
LAB_001808c3:
        conv3x3s1_winograd63_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,iVar59,
                   uVar56,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_00180d4b;
LAB_00180cae:
        conv3x3s1_winograd43_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,iVar59,
                   uVar56,opt);
      }
    }
    else {
      pMVar15 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((pMVar15 ==
            (this->super_Convolution).super_Layer.top_shapes.
            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish) || (iVar68 = pMVar15->w, iVar68 == 0)) ||
         (iVar65 = pMVar15->h, iVar65 == 0)) {
        iVar68 = pMVar14->w;
        iVar65 = pMVar14->h;
        iVar33 = (this->super_Convolution).pad_left;
        if ((((iVar33 < 1) && (iVar10 = (this->super_Convolution).pad_right, iVar10 < 1)) &&
            (iVar11 = (this->super_Convolution).pad_top, iVar11 < 1)) &&
           (iVar12 = (this->super_Convolution).pad_bottom, iVar12 < 1)) {
          if ((iVar12 == -0xe9 && (iVar11 == -0xe9 && (iVar10 == -0xe9 && iVar33 == -0xe9))) ||
             (iVar12 == -0xea && (iVar11 == -0xea && (iVar10 == -0xea && iVar33 == -0xea))))
          goto LAB_0018075c;
        }
        else {
          iVar68 = iVar33 + iVar68 + (this->super_Convolution).pad_right;
          iVar65 = iVar65 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom
          ;
        }
      }
      else {
LAB_0018075c:
        iVar68 = iVar68 + 2;
        iVar65 = iVar65 + 2;
      }
      bVar30 = test_prefer_winograd63(iVar59,uVar56,iVar68,iVar65);
      bVar31 = test_prefer_winograd23(iVar59,uVar56,iVar68,iVar65);
      bVar37 = bVar31 & bVar42;
      if (!bVar31) {
        bVar42 = bVar30;
      }
      bVar32 = bVar30 & opt->use_winograd63_convolution;
      bVar42 = (opt->use_winograd63_convolution ^ 1U) & bVar30 | bVar42 ^ 1;
      if ((bVar42 == 1) && (opt->use_winograd43_convolution == false)) {
        bVar32 = bVar32 | opt->use_winograd63_convolution;
        bVar37 = bVar37 | opt->use_winograd63_convolution ^ 1U;
        bVar42 = 0;
      }
      if (bVar37 == 0) {
        if (bVar42 != 0) goto LAB_00180cae;
        if ((bVar32 & 1) != 0) goto LAB_001808c3;
      }
      else {
LAB_00180d4b:
        conv3x3s1_winograd23_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,iVar59,
                   uVar56,opt);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar16 = (this->super_Convolution).weight_data.refcount;
    if (piVar16 == (int *)0x0) goto LAB_00180ff0;
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) goto LAB_00180ff0;
    pvVar17 = (this->super_Convolution).weight_data.data;
    pAVar18 = (this->super_Convolution).weight_data.allocator;
  }
  else {
    iVar33 = get_cpu_level2_cache_size();
    uVar56 = (this->super_Convolution).num_output;
    uVar49 = (this->super_Convolution).kernel_w;
    local_368 = (ulong)uVar56;
    uVar66 = (this->super_Convolution).kernel_h;
    uVar7 = (this->super_Convolution).dilation_w;
    uVar8 = (this->super_Convolution).dilation_h;
    uVar9 = (this->super_Convolution).stride_w;
    iVar65 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar33 < (int)(uVar56 * uVar49 * uVar66 * uVar7 * uVar8 * uVar9 * iVar65 * iVar59 * 8) ||
         (0x10 < iVar59 || 0x10 < (int)uVar56))) || (uVar66 == 1 && uVar49 == 1)) {
      uVar66 = uVar66 * uVar49;
      local_338 = (ulong)(uVar66 * iVar59);
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar56,0,uVar66 * iVar59,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar43 = (int)(TILE_M + uVar56 + -1) / TILE_M;
      local_390 = 1;
      if (opt->use_packing_layout == true) {
        if ((uVar47 & 0xf) == 0) {
          local_390 = 0x10;
        }
        else if ((uVar47 & 7) == 0) {
          local_390 = 8;
        }
        else {
          local_390 = (ulong)((uint)((uVar47 & 3) == 0) * 3 + 1);
        }
      }
      local_108 = &(this->super_Convolution).weight_data;
      local_2e8 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_308 = (Allocator *)0x0;
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0[0] = 0;
      if (uVar66 == 1) {
        Mat::reshape((Mat *)&pd_5,local_108,(int)local_338,uVar56,(Allocator *)0x0);
        piVar16 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_308 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_308->_vptr_Allocator[3])();
            }
          }
        }
        piVar16 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_308 = local_268;
        iStack_300 = local_260._0_4_;
        uStack_2f8 = local_260._8_8_;
        local_2f0[0] = local_250;
        local_2e8 = local_248;
        iStack_2fc = iStack_25c;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_268 == (Allocator *)0x0) {
              if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
                free(pd_5._vptr_ParamDict);
              }
            }
            else {
              (*local_268->_vptr_Allocator[3])();
            }
          }
        }
        pd_5._vptr_ParamDict = (_func_int **)0x0;
        pd_5.d._0_4_ = 0;
        pd_5.d._4_4_ = 0;
      }
      else {
        Mat::reshape((Mat *)&pd_5,local_108,uVar66,iVar59,uVar56,(Allocator *)0x0);
        Mat::create((Mat *)&pd,(int)local_338,uVar56,4,(Allocator *)0x0);
        if (0 < (int)uVar56) {
          uVar47 = 0;
          do {
            if ((int)local_390 <= iVar59) {
              pp_Var35 = (_func_int **)(local_278 * local_248 * uVar47 + (long)pd_5._vptr_ParamDict)
              ;
              lVar36 = 0;
              pp_Var61 = pd._vptr_ParamDict;
              do {
                if (0 < (int)uVar66) {
                  uVar41 = 0;
                  uVar44 = local_390;
                  pp_Var64 = pp_Var35;
                  pp_Var63 = pp_Var35;
                  do {
                    do {
                      *(undefined4 *)pp_Var61 = *(undefined4 *)pp_Var64;
                      pp_Var61 = (_func_int **)((long)pp_Var61 + 4);
                      uVar44 = uVar44 - 1;
                      pp_Var64 = (_func_int **)((long)pp_Var64 + (long)iStack_25c * local_278);
                    } while (uVar44 != 0);
                    uVar41 = uVar41 + 1;
                    pp_Var64 = (_func_int **)((long)pp_Var63 + 4);
                    uVar44 = local_390;
                    pp_Var63 = pp_Var64;
                  } while (uVar41 != uVar66);
                }
                lVar36 = lVar36 + local_390;
                pp_Var35 = (_func_int **)((long)pp_Var35 + (long)iStack_25c * local_278 * local_390)
                ;
              } while (lVar36 < (long)((long)iVar59 - (ulong)((int)local_390 - 1)));
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_368);
        }
        piVar16 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_268 == (Allocator *)0x0) {
              if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
                free(pd_5._vptr_ParamDict);
              }
            }
            else {
              (*local_268->_vptr_Allocator[3])();
            }
          }
        }
      }
      local_130 = (long)TILE_K;
      local_1d8 = (long)TILE_M;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,((int)local_338 + TILE_K + -1) / TILE_K,
                  ((int)local_368 + -1 + TILE_M) / TILE_M,4,(Allocator *)0x0);
      if (0 < (int)uVar43) {
        local_e8 = (long)(int)local_338;
        local_f8 = (ulong)uVar43;
        local_f0 = local_130 * 4;
        local_100 = local_1d8 * 4;
        local_138 = 8;
        local_140 = 0xc;
        local_148 = 0x10;
        local_150 = 0x14;
        local_158 = 0x18;
        local_160 = 0x1c;
        local_168 = 0x20;
        local_170 = 0x24;
        local_178 = 0x3c;
        local_180 = 0x38;
        local_188 = 0x34;
        local_190 = 0x30;
        local_198 = 0x2c;
        local_1a0 = 0x28;
        local_1a8 = 7;
        local_1b0 = 6;
        local_1b8 = 5;
        local_1c0 = 4;
        local_1f0 = 3;
        local_1f8 = 2;
        local_238 = 1;
        local_240 = 0;
        local_1c8 = 4;
        local_1d0 = 0;
        uVar47 = 0;
        do {
          local_330 = uVar47 * local_1d8;
          local_360 = (int)local_368 - (int)local_330;
          if ((int)(uint)local_1d8 < (int)local_360) {
            local_360 = (uint)local_1d8;
          }
          if (0 < (int)local_338) {
            local_48 = (ulong)local_360;
            local_290 = (long)(int)local_360;
            local_298 = 0;
            uVar44 = local_338;
            uVar41 = 0;
            do {
              local_340 = uVar41;
              uVar56 = (uint)local_130;
              local_1e4 = (uint)uVar44;
              local_35c = local_1e4;
              if ((int)uVar56 < (int)local_1e4) {
                local_35c = uVar56;
              }
              uVar43 = (int)local_338 - (int)local_340;
              if ((int)uVar56 < (int)uVar43) {
                uVar43 = uVar56;
              }
              sVar19 = (this->weight_sgemm_data).elemsize;
              pauVar48 = (undefined1 (*) [64])
                         ((long)(this->weight_sgemm_data).data +
                         (long)(this->weight_sgemm_data).w * sVar19 *
                         (long)(int)((long)((ulong)(uint)((int)local_340 >> 0x1f) << 0x20 |
                                           local_340 & 0xffffffff) / (long)(int)uVar56) +
                         (this->weight_sgemm_data).cstep * uVar47 * sVar19);
              uVar44 = 0;
              lVar36 = (long)iStack_2fc;
              if (0xf < (int)local_360) {
                local_1e0 = uVar43 & 0xfffffff0;
                lVar45 = local_1d0 * lVar36 + local_298;
                local_40 = lVar36 * 0x40;
                local_60 = local_1c8 * lVar36 + local_298;
                local_68 = local_138 * lVar36 + local_298;
                local_70 = local_140 * lVar36 + local_298;
                local_78 = local_148 * lVar36 + local_298;
                local_80 = local_150 * lVar36 + local_298;
                local_88 = local_158 * lVar36 + local_298;
                local_90 = local_160 * lVar36 + local_298;
                local_98 = local_168 * lVar36 + local_298;
                local_a0 = local_170 * lVar36 + local_298;
                local_a8 = local_178 * lVar36 + local_298;
                local_b0 = local_180 * lVar36 + local_298;
                local_b8 = local_188 * lVar36 + local_298;
                local_c0 = local_190 * lVar36 + local_298;
                local_c8 = local_198 * lVar36 + local_298;
                local_d0 = local_1a0 * lVar36 + local_298;
                lVar71 = lVar36 * 4;
                lVar39 = 0;
                uVar41 = 0;
                do {
                  if ((int)uVar43 < 0x10) {
                    local_348 = (long)pd._vptr_ParamDict + (uVar41 + local_330 + 3) * lVar36 * 4;
                    local_350 = (long)pd._vptr_ParamDict + (uVar41 + local_330 + 4) * lVar36 * 4;
                    local_358 = (long)pd._vptr_ParamDict + (uVar41 + local_330 + 5) * lVar36 * 4;
                    local_50 = (long)pd._vptr_ParamDict + (uVar41 + local_330 + 8) * lVar36 * 4;
                    local_58 = (long)pd._vptr_ParamDict + (uVar41 + local_330 + 9) * lVar36 * 4;
                    local_220 = (long)pd._vptr_ParamDict +
                                local_340 * 4 + (uVar41 + local_330) * lVar36 * 4;
                    local_228 = (long)pd._vptr_ParamDict +
                                local_340 * 4 + (uVar41 + local_330 + 1) * lVar36 * 4;
                    local_110 = (long)pd._vptr_ParamDict +
                                local_340 * 4 + (uVar41 + local_330 + 2) * lVar36 * 4;
                    local_118 = local_348 + local_340 * 4;
                    local_120 = local_350 + local_340 * 4;
                    local_128 = local_358 + local_340 * 4;
                    lVar51 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 6) * lVar36 * 4;
                    uVar44 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 7) * lVar36 * 4;
                    lVar67 = local_50 + local_340 * 4;
                    lVar38 = local_58 + local_340 * 4;
                    lVar62 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 10) * lVar36 * 4;
                    lVar57 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 0xb) * lVar36 * 4;
                    local_230 = (long)pd._vptr_ParamDict +
                                local_340 * 4 + (uVar41 + local_330 + 0xc) * lVar36 * 4;
                    lVar40 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 0xd) * lVar36 * 4;
                    lVar72 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (uVar41 + local_330 + 0xe) * lVar36 * 4;
                    uVar52 = (long)pd._vptr_ParamDict +
                             local_340 * 4 + (local_330 + uVar41 + 0xf) * lVar36 * 4;
                    uVar49 = 0;
                  }
                  else {
                    lVar62 = (long)pd._vptr_ParamDict + lVar39;
                    iVar59 = 0xf;
                    do {
                      lVar51 = lVar62 + lVar45;
                      lVar67 = lVar51 + lVar36 * 8;
                      auVar75 = *(undefined1 (*) [64])(lVar51 + lVar36 * 4);
                      auVar77 = *(undefined1 (*) [64])(lVar51 + lVar36 * 8);
                      auVar78 = *(undefined1 (*) [64])(lVar67 + lVar36 * 4);
                      lVar38 = lVar36 * 8 + lVar67;
                      auVar79 = *(undefined1 (*) [64])(lVar67 + lVar36 * 8);
                      lVar51 = lVar38 + lVar36 * 4;
                      auVar80 = *(undefined1 (*) [64])(lVar38 + lVar36 * 4);
                      auVar81 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar82 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar83 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar84 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar85 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar86 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar87 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar88 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      lVar51 = lVar51 + lVar71;
                      auVar89 = *(undefined1 (*) [64])(lVar71 + lVar51);
                      auVar90 = *(undefined1 (*) [64])(lVar51 + lVar36 * 8);
                      auVar74 = vunpcklps_avx512f(*(undefined1 (*) [64])(lVar62 + lVar45),auVar75);
                      auVar75 = vunpckhps_avx512f(*(undefined1 (*) [64])(lVar62 + lVar45),auVar75);
                      auVar76 = vunpcklps_avx512f(auVar77,auVar78);
                      auVar77 = vunpckhps_avx512f(auVar77,auVar78);
                      auVar78 = vunpcklps_avx512f(auVar79,auVar80);
                      auVar79 = vunpckhps_avx512f(auVar79,auVar80);
                      auVar80 = vunpcklps_avx512f(auVar81,auVar82);
                      auVar81 = vunpckhps_avx512f(auVar81,auVar82);
                      auVar82 = vunpcklps_avx512f(auVar83,auVar84);
                      auVar83 = vunpckhps_avx512f(auVar83,auVar84);
                      auVar84 = vunpcklps_avx512f(auVar85,auVar86);
                      auVar85 = vunpckhps_avx512f(auVar85,auVar86);
                      auVar86 = vunpcklps_avx512f(auVar87,auVar88);
                      auVar87 = vunpckhps_avx512f(auVar87,auVar88);
                      auVar88 = vunpcklps_avx512f(auVar89,auVar90);
                      auVar89 = vunpckhps_avx512f(auVar89,auVar90);
                      auVar90 = vunpcklpd_avx512f(auVar74,auVar76);
                      auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
                      auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
                      auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
                      auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
                      auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
                      auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
                      auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
                      auVar81 = vunpcklpd_avx512f(auVar82,auVar84);
                      auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
                      auVar84 = vunpcklpd_avx512f(auVar83,auVar85);
                      auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
                      auVar85 = vunpcklpd_avx512f(auVar86,auVar88);
                      auVar86 = vunpckhpd_avx512f(auVar86,auVar88);
                      auVar88 = vunpcklpd_avx512f(auVar87,auVar89);
                      auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
                      auVar89 = vshuff64x2_avx512f(auVar90,auVar77,0x88);
                      auVar91 = vshuff64x2_avx512f(auVar81,auVar85,0x88);
                      auVar92 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
                      auVar93 = vshuff64x2_avx512f(auVar82,auVar86,0x88);
                      auVar94 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
                      auVar95 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
                      auVar96 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
                      auVar97 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
                      auVar77 = vshuff64x2_avx512f(auVar90,auVar77,0xdd);
                      auVar81 = vshuff64x2_avx512f(auVar81,auVar85,0xdd);
                      auVar78 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
                      auVar82 = vshuff64x2_avx512f(auVar82,auVar86,0xdd);
                      auVar80 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
                      auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
                      auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
                      auVar79 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
                      auVar83 = vshuff64x2_avx512f(auVar89,auVar91,0x88);
                      auVar85 = vshuff64x2_avx512f(auVar92,auVar93,0x88);
                      auVar86 = vshuff64x2_avx512f(auVar94,auVar95,0x88);
                      auVar87 = vshuff64x2_avx512f(auVar96,auVar97,0x88);
                      auVar88 = vshuff64x2_avx512f(auVar77,auVar81,0x88);
                      auVar90 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
                      auVar74 = vshuff64x2_avx512f(auVar80,auVar84,0x88);
                      auVar76 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
                      auVar89 = vshuff64x2_avx512f(auVar89,auVar91,0xdd);
                      auVar91 = vshuff64x2_avx512f(auVar92,auVar93,0xdd);
                      auVar92 = vshuff64x2_avx512f(auVar94,auVar95,0xdd);
                      auVar93 = vshuff64x2_avx512f(auVar96,auVar97,0xdd);
                      auVar77 = vshuff64x2_avx512f(auVar77,auVar81,0xdd);
                      auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
                      auVar80 = vshuff64x2_avx512f(auVar80,auVar84,0xdd);
                      auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
                      *pauVar48 = auVar83;
                      pauVar48[1] = auVar85;
                      pauVar48[2] = auVar86;
                      pauVar48[3] = auVar87;
                      pauVar48[4] = auVar88;
                      pauVar48[5] = auVar90;
                      pauVar48[6] = auVar74;
                      pauVar48[7] = auVar76;
                      pauVar48[8] = auVar89;
                      pauVar48[9] = auVar91;
                      pauVar48[10] = auVar92;
                      pauVar48[0xb] = auVar93;
                      pauVar48[0xc] = auVar77;
                      pauVar48[0xd] = auVar78;
                      pauVar48[0xe] = auVar80;
                      pauVar48[0xf] = auVar75;
                      pauVar48 = pauVar48 + 0x10;
                      lVar62 = lVar62 + 0x40;
                      iVar59 = iVar59 + 0x10;
                    } while (iVar59 < (int)uVar43);
                    local_220 = lVar45 + lVar62;
                    local_228 = lVar62 + local_60;
                    local_110 = lVar62 + local_68;
                    local_118 = lVar62 + local_70;
                    local_120 = lVar62 + local_78;
                    local_128 = lVar62 + local_80;
                    lVar51 = lVar62 + local_88;
                    uVar44 = lVar62 + local_90;
                    lVar67 = lVar62 + local_98;
                    lVar38 = lVar62 + local_a0;
                    uVar52 = lVar62 + local_a8;
                    lVar72 = lVar62 + local_b0;
                    lVar40 = lVar62 + local_b8;
                    local_230 = local_c0 + lVar62;
                    lVar57 = local_c8 + lVar62;
                    lVar62 = lVar62 + local_d0;
                    uVar49 = local_1e0;
                  }
                  if ((int)uVar49 < (int)uVar43) {
                    lVar70 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(local_220 + lVar70 * 4);
                      *(undefined4 *)((long)*pauVar48 + 4) = *(undefined4 *)(local_228 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 8) = *(undefined4 *)(local_110 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0xc) =
                           *(undefined4 *)(local_118 + lVar70 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0x10) =
                           *(undefined4 *)(local_120 + lVar70 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0x14) =
                           *(undefined4 *)(local_128 + lVar70 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0x18) = *(undefined4 *)(lVar51 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x1c) = *(undefined4 *)(uVar44 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x20) = *(undefined4 *)(lVar67 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x24) = *(undefined4 *)(lVar38 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x28) = *(undefined4 *)(lVar62 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x2c) = *(undefined4 *)(lVar57 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x30) =
                           *(undefined4 *)(local_230 + lVar70 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0x34) = *(undefined4 *)(lVar40 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x38) = *(undefined4 *)(lVar72 + lVar70 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar48 + 0x3c) = *(undefined4 *)(uVar52 + lVar70 * 4)
                      ;
                      pauVar48 = pauVar48 + 1;
                      lVar70 = lVar70 + 1;
                      local_358 = lVar67;
                      local_350 = uVar44;
                      local_348 = uVar52;
                    } while (local_35c - uVar49 != (int)lVar70);
                  }
                  uVar44 = uVar41 + 0x10;
                  uVar52 = uVar41 + 0x1f;
                  lVar39 = lVar39 + local_40;
                  uVar41 = uVar44;
                  local_d8 = lVar36;
                } while (uVar52 < local_48);
              }
              if ((int)((uint)uVar44 | 7) < (int)local_360) {
                uVar41 = uVar44 & 0xffffffff;
                lVar71 = local_298 + (local_1a8 + uVar41) * lVar36 * 4;
                lVar51 = lVar36 * 0x20;
                lVar39 = local_298 + (local_1b0 + uVar41) * lVar36 * 4;
                local_348 = local_298 + (local_1b8 + uVar41) * lVar36 * 4;
                local_350 = local_298 + (local_1c0 + uVar41) * lVar36 * 4;
                local_358 = local_298 + (local_1f0 + uVar41) * lVar36 * 4;
                local_210 = local_298 + (local_1f8 + uVar41) * lVar36 * 4;
                local_218 = local_298 + (local_238 + uVar41) * lVar36 * 4;
                lVar45 = local_298 + (local_240 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar43 < 8) {
                    lVar67 = local_340 * 4 + (uVar41 + local_330) * lVar36 * 4;
                    lVar28 = local_340 * 4 + (uVar41 + local_330 + 1) * lVar36 * 4;
                    lVar70 = local_340 * 4 + (uVar41 + local_330 + 2) * lVar36 * 4;
                    lVar62 = local_340 * 4 + (uVar41 + local_330 + 3) * lVar36 * 4;
                    lVar57 = local_340 * 4 + (uVar41 + local_330 + 4) * lVar36 * 4;
                    lVar40 = local_340 * 4 + (uVar41 + local_330 + 5) * lVar36 * 4;
                    lVar72 = local_340 * 4 + (uVar41 + local_330 + 6) * lVar36 * 4;
                    lVar38 = local_340 * 4 + (local_330 + uVar41 + 7) * lVar36 * 4;
                    uVar49 = 0;
                  }
                  else {
                    iVar59 = 7;
                    lVar67 = 0;
                    pauVar29 = pauVar48;
                    do {
                      pauVar46 = pauVar29;
                      pauVar54 = (undefined1 (*) [32])((long)*pauVar48 + lVar67 * 2 * 4);
                      lVar38 = lVar67 + lVar45;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar67 + lVar45);
                      lVar72 = lVar36 * 8 + lVar38;
                      auVar100 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar38);
                      auVar102 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar38);
                      auVar3 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar72);
                      lVar38 = lVar36 * 8 + lVar72;
                      auVar4 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar72);
                      lVar72 = lVar36 * 4 + lVar38;
                      auVar103 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar38);
                      auVar5 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar72);
                      auVar6 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar72);
                      auVar22 = vunpcklps_avx(auVar2,auVar100);
                      auVar100 = vunpckhps_avx(auVar2,auVar100);
                      auVar2 = vunpcklps_avx(auVar102,auVar3);
                      auVar102 = vunpckhps_avx(auVar102,auVar3);
                      auVar104 = vunpcklps_avx(auVar4,auVar103);
                      auVar3 = vunpckhps_avx(auVar4,auVar103);
                      auVar105 = vunpcklps_avx(auVar5,auVar6);
                      auVar4 = vunpckhps_avx(auVar5,auVar6);
                      auVar103 = vunpcklpd_avx(auVar22,auVar2);
                      auVar2 = vunpckhpd_avx(auVar22,auVar2);
                      auVar5 = vunpcklpd_avx(auVar100,auVar102);
                      auVar100 = vunpckhpd_avx(auVar100,auVar102);
                      auVar6 = vunpcklpd_avx(auVar104,auVar105);
                      auVar102 = vunpckhpd_avx(auVar104,auVar105);
                      auVar22 = vunpcklpd_avx(auVar3,auVar4);
                      auVar3 = vunpckhpd_avx(auVar3,auVar4);
                      auVar104._16_16_ = auVar6._0_16_;
                      auVar104._0_16_ = auVar103._0_16_;
                      auVar105._16_16_ = auVar102._0_16_;
                      auVar105._0_16_ = auVar2._0_16_;
                      auVar106._16_16_ = auVar22._0_16_;
                      auVar106._0_16_ = auVar5._0_16_;
                      auVar107._16_16_ = auVar3._0_16_;
                      auVar107._0_16_ = auVar100._0_16_;
                      auVar4 = vperm2f128_avx(auVar103,auVar6,0x31);
                      auVar2 = vperm2f128_avx(auVar2,auVar102,0x31);
                      auVar102 = vperm2f128_avx(auVar5,auVar22,0x31);
                      auVar100 = vperm2f128_avx(auVar100,auVar3,0x31);
                      *pauVar54 = auVar104;
                      pauVar54[1] = auVar105;
                      pauVar54[2] = auVar106;
                      pauVar54[3] = auVar107;
                      pauVar54[4] = auVar4;
                      pauVar54[5] = auVar2;
                      pauVar54[6] = auVar102;
                      pauVar54[7] = auVar100;
                      lVar67 = lVar67 + 0x20;
                      iVar59 = iVar59 + 8;
                      pauVar29 = (undefined1 (*) [64])(pauVar54 + 8);
                    } while (iVar59 < (int)uVar43);
                    pauVar48 = pauVar46 + 4;
                    lVar38 = lVar67 + lVar71;
                    lVar72 = lVar67 + lVar39;
                    lVar40 = lVar67 + local_348;
                    lVar57 = lVar67 + local_350;
                    lVar62 = lVar67 + local_358;
                    lVar70 = lVar67 + local_210;
                    lVar28 = lVar67 + local_218;
                    lVar67 = lVar67 + lVar45;
                    uVar49 = uVar43 & 0xfffffff8;
                  }
                  if ((int)uVar49 < (int)uVar43) {
                    iVar59 = local_35c - uVar49;
                    lVar53 = 0;
                    pauVar29 = pauVar48;
                    do {
                      pauVar46 = pauVar29;
                      puVar1 = (undefined4 *)((long)*pauVar48 + lVar53 * 2 * 4);
                      *puVar1 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar67);
                      puVar1[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar28);
                      puVar1[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar70);
                      puVar1[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar62);
                      puVar1[4] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar57);
                      puVar1[5] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar40);
                      puVar1[6] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar72);
                      puVar1[7] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar38);
                      lVar53 = lVar53 + 4;
                      iVar59 = iVar59 + -1;
                      pauVar29 = (undefined1 (*) [64])(puVar1 + 8);
                    } while (iVar59 != 0);
                    pauVar48 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
                  }
                  uVar44 = uVar41 + 8;
                  lVar67 = uVar41 + 0xf;
                  lVar71 = lVar71 + lVar51;
                  lVar39 = lVar39 + lVar51;
                  local_348 = local_348 + lVar51;
                  local_350 = local_350 + lVar51;
                  local_358 = local_358 + lVar51;
                  local_210 = local_210 + lVar51;
                  local_218 = local_218 + lVar51;
                  lVar45 = lVar45 + lVar51;
                  uVar41 = uVar44;
                } while (lVar67 < local_290);
              }
              if ((int)((uint)uVar44 | 3) < (int)local_360) {
                uVar41 = uVar44 & 0xffffffff;
                lVar71 = local_298 + (local_1f0 + uVar41) * lVar36 * 4;
                lVar67 = lVar36 * 0x10;
                lVar39 = local_298 + (local_1f8 + uVar41) * lVar36 * 4;
                lVar45 = local_298 + (local_238 + uVar41) * lVar36 * 4;
                lVar51 = local_298 + (local_240 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar43 < 8) {
                    uVar49 = 0;
                    lVar57 = local_340 * 4 + (local_330 + uVar41) * lVar36 * 4;
                    lVar40 = local_340 * 4 + (local_330 + uVar41 + 1) * lVar36 * 4;
                    lVar72 = local_340 * 4 + (local_330 + uVar41 + 2) * lVar36 * 4;
                    lVar38 = local_340 * 4 + (local_330 + uVar41 + 3) * lVar36 * 4;
                  }
                  else {
                    iVar59 = 7;
                    lVar57 = 0;
                    pauVar29 = pauVar48;
                    do {
                      pauVar46 = pauVar29;
                      pauVar54 = (undefined1 (*) [32])((long)*pauVar48 + lVar57 * 4);
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar57 + lVar51);
                      auVar100 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar57 + lVar45);
                      auVar102 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar57 + lVar39);
                      auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar57 + lVar71);
                      auVar4 = vunpcklps_avx(auVar2,auVar100);
                      auVar100 = vunpckhps_avx(auVar2,auVar100);
                      auVar2 = vunpcklps_avx(auVar102,auVar3);
                      auVar102 = vunpckhps_avx(auVar102,auVar3);
                      auVar3 = vunpcklpd_avx(auVar4,auVar2);
                      auVar2 = vunpckhpd_avx(auVar4,auVar2);
                      auVar4 = vunpcklpd_avx(auVar100,auVar102);
                      auVar100 = vunpckhpd_avx(auVar100,auVar102);
                      auVar102._16_16_ = auVar2._0_16_;
                      auVar102._0_16_ = auVar3._0_16_;
                      auVar103._16_16_ = auVar100._0_16_;
                      auVar103._0_16_ = auVar4._0_16_;
                      auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
                      auVar100 = vperm2f128_avx(auVar4,auVar100,0x31);
                      *pauVar54 = auVar102;
                      pauVar54[1] = auVar103;
                      pauVar54[2] = auVar2;
                      pauVar54[3] = auVar100;
                      lVar57 = lVar57 + 0x20;
                      iVar59 = iVar59 + 8;
                      pauVar29 = (undefined1 (*) [64])(pauVar54 + 4);
                    } while (iVar59 < (int)uVar43);
                    pauVar48 = pauVar46 + 2;
                    lVar38 = lVar57 + lVar71;
                    lVar72 = lVar57 + lVar39;
                    lVar40 = lVar57 + lVar45;
                    lVar57 = lVar57 + lVar51;
                    uVar49 = uVar43 & 0xfffffff8;
                  }
                  lVar72 = (long)pd._vptr_ParamDict + lVar72;
                  lVar38 = (long)pd._vptr_ParamDict + lVar38;
                  lVar57 = (long)pd._vptr_ParamDict + lVar57;
                  lVar40 = (long)pd._vptr_ParamDict + lVar40;
                  if ((int)(uVar49 | 3) < (int)uVar43) {
                    lVar62 = 0;
                    pauVar29 = pauVar48;
                    uVar66 = uVar49;
                    do {
                      pauVar46 = pauVar29;
                      auVar98 = vunpcklps_avx(*(undefined1 (*) [16])(lVar57 + lVar62),
                                              *(undefined1 (*) [16])(lVar40 + lVar62));
                      auVar21 = vunpcklps_avx(*(undefined1 (*) [16])(lVar72 + lVar62),
                                              *(undefined1 (*) [16])(lVar38 + lVar62));
                      auVar23 = vunpckhps_avx(*(undefined1 (*) [16])(lVar57 + lVar62),
                                              *(undefined1 (*) [16])(lVar40 + lVar62));
                      auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(lVar72 + lVar62),
                                              *(undefined1 (*) [16])(lVar38 + lVar62));
                      auVar101 = vunpcklpd_avx(auVar98,auVar21);
                      auVar98 = vunpckhpd_avx(auVar98,auVar21);
                      auVar21 = vunpcklpd_avx(auVar23,auVar99);
                      auVar23 = vunpckhpd_avx(auVar23,auVar99);
                      pauVar29 = (undefined1 (*) [64])((long)pauVar48[1] + lVar62 * 4);
                      *(undefined1 (*) [16])pauVar29[-1] = auVar101;
                      *(undefined1 (*) [16])((long)pauVar29[-1] + 0x10) = auVar98;
                      *(undefined1 (*) [16])((long)pauVar29[-1] + 0x20) = auVar21;
                      *(undefined1 (*) [16])((long)pauVar29[-1] + 0x30) = auVar23;
                      uVar49 = uVar66 + 4;
                      lVar62 = lVar62 + 0x10;
                      iVar59 = uVar66 + 7;
                      uVar66 = uVar49;
                    } while (iVar59 < (int)uVar43);
                    pauVar48 = pauVar46 + 1;
                    lVar38 = lVar38 + lVar62;
                    lVar72 = lVar72 + lVar62;
                    lVar40 = lVar40 + lVar62;
                    lVar57 = lVar57 + lVar62;
                  }
                  if ((int)uVar49 < (int)uVar43) {
                    lVar62 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(lVar57 + lVar62 * 4);
                      *(undefined4 *)((long)*pauVar48 + 4) = *(undefined4 *)(lVar40 + lVar62 * 4);
                      *(undefined4 *)((long)*pauVar48 + 8) = *(undefined4 *)(lVar72 + lVar62 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0xc) = *(undefined4 *)(lVar38 + lVar62 * 4);
                      pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 0x10);
                      lVar62 = lVar62 + 1;
                    } while (local_35c - uVar49 != (int)lVar62);
                  }
                  uVar44 = uVar41 + 4;
                  lVar38 = uVar41 + 7;
                  lVar71 = lVar71 + lVar67;
                  lVar39 = lVar39 + lVar67;
                  lVar45 = lVar45 + lVar67;
                  lVar51 = lVar51 + lVar67;
                  uVar41 = uVar44;
                } while (lVar38 < local_290);
              }
              if ((int)((uint)uVar44 | 1) < (int)local_360) {
                uVar41 = (ulong)(int)(uint)uVar44;
                lVar71 = local_298 + (local_238 + uVar41) * lVar36 * 4;
                lVar39 = local_298 + (local_240 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar43 < 8) {
                    uVar49 = 0;
                    lVar51 = local_340 * 4 + (uVar41 + local_330) * lVar36 * 4;
                    lVar45 = local_340 * 4 + (local_330 + uVar41 + 1) * lVar36 * 4;
                  }
                  else {
                    iVar59 = 7;
                    lVar51 = 0;
                    pauVar29 = pauVar48;
                    do {
                      pauVar46 = pauVar29;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar51 + lVar39);
                      auVar100 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar51 + lVar71);
                      auVar102 = vunpcklps_avx(auVar2,auVar100);
                      auVar2 = vunpckhps_avx(auVar2,auVar100);
                      auVar100._16_16_ = auVar2._0_16_;
                      auVar100._0_16_ = auVar102._0_16_;
                      auVar2 = vperm2f128_avx(auVar102,auVar2,0x31);
                      pauVar54 = (undefined1 (*) [32])((long)*pauVar48 + lVar51 * 2);
                      *pauVar54 = auVar100;
                      pauVar54[1] = auVar2;
                      lVar51 = lVar51 + 0x20;
                      iVar59 = iVar59 + 8;
                      pauVar29 = (undefined1 (*) [64])(pauVar54 + 2);
                    } while (iVar59 < (int)uVar43);
                    pauVar48 = pauVar46 + 1;
                    lVar45 = lVar51 + lVar71;
                    lVar51 = lVar51 + lVar39;
                    uVar49 = uVar43 & 0xfffffff8;
                  }
                  pauVar60 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar45);
                  pauVar58 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar51);
                  uVar66 = uVar49 | 3;
                  while ((int)uVar66 < (int)uVar43) {
                    auVar23 = vunpcklps_avx(*pauVar58,*pauVar60);
                    auVar98 = vunpckhps_avx(*pauVar58,*pauVar60);
                    *(undefined1 (*) [16])*pauVar48 = auVar23;
                    *(undefined1 (*) [16])((long)*pauVar48 + 0x10) = auVar98;
                    pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 0x20);
                    pauVar58 = pauVar58 + 1;
                    pauVar60 = pauVar60 + 1;
                    uVar66 = uVar49 + 7;
                    uVar49 = uVar49 + 4;
                  }
                  if ((int)uVar49 < (int)uVar43) {
                    lVar45 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(*pauVar58 + lVar45 * 4);
                      *(undefined4 *)((long)*pauVar48 + 4) = *(undefined4 *)(*pauVar60 + lVar45 * 4)
                      ;
                      pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 8);
                      lVar45 = lVar45 + 1;
                    } while (local_35c - uVar49 != (int)lVar45);
                  }
                  uVar44 = uVar41 + 2;
                  lVar45 = uVar41 + 3;
                  lVar71 = lVar71 + lVar36 * 8;
                  lVar39 = lVar39 + lVar36 * 8;
                  uVar41 = uVar44;
                } while (lVar45 < local_290);
              }
              if ((int)uVar44 < (int)local_360) {
                lVar71 = (long)(int)uVar44;
                do {
                  pauVar54 = (undefined1 (*) [32])
                             ((long)pd._vptr_ParamDict +
                             local_340 * 4 + (local_330 + lVar71) * lVar36 * 4);
                  uVar49 = 0;
                  if (7 < (int)uVar43) {
                    iVar59 = 7;
                    do {
                      *(undefined1 (*) [32])*pauVar48 = *pauVar54;
                      pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 0x20);
                      pauVar54 = pauVar54 + 1;
                      iVar59 = iVar59 + 8;
                      uVar49 = uVar43 & 0xfffffff8;
                    } while (iVar59 < (int)uVar43);
                  }
                  uVar66 = uVar49 | 3;
                  while ((int)uVar66 < (int)uVar43) {
                    *(undefined1 (*) [16])*pauVar48 = *(undefined1 (*) [16])*pauVar54;
                    pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 0x10);
                    pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                    uVar66 = uVar49 + 7;
                    uVar49 = uVar49 + 4;
                  }
                  if ((int)uVar49 < (int)uVar43) {
                    lVar39 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(*pauVar54 + lVar39 * 4);
                      pauVar48 = (undefined1 (*) [64])((long)*pauVar48 + 4);
                      lVar39 = lVar39 + 1;
                    } while (local_35c - uVar49 != (int)lVar39);
                  }
                  lVar71 = lVar71 + 1;
                } while (lVar71 != local_290);
              }
              local_298 = local_298 + local_f0;
              uVar44 = (ulong)(local_1e4 - uVar56);
              uVar41 = local_340 + local_130;
              local_e0 = uVar47;
            } while ((long)(local_340 + local_130) < local_e8);
          }
          uVar47 = uVar47 + 1;
          local_1d0 = local_1d0 + local_100;
          local_1c8 = local_1c8 + local_100;
          local_138 = local_138 + local_100;
          local_140 = local_140 + local_100;
          local_148 = local_148 + local_100;
          local_150 = local_150 + local_100;
          local_158 = local_158 + local_100;
          local_160 = local_160 + local_100;
          local_168 = local_168 + local_100;
          local_170 = local_170 + local_100;
          local_178 = local_178 + local_100;
          local_180 = local_180 + local_100;
          local_188 = local_188 + local_100;
          local_190 = local_190 + local_100;
          local_198 = local_198 + local_100;
          local_1a0 = local_1a0 + local_100;
          local_1a8 = local_1a8 + local_1d8;
          local_1b0 = local_1b0 + local_1d8;
          local_1b8 = local_1b8 + local_1d8;
          local_1c0 = local_1c0 + local_1d8;
          local_1f0 = local_1f0 + local_1d8;
          local_1f8 = local_1f8 + local_1d8;
          local_238 = local_238 + local_1d8;
          local_240 = local_240 + local_1d8;
        } while (uVar47 != local_f8);
      }
      piVar16 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_308 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_308->_vptr_Allocator[3])();
          }
        }
      }
      local_2e8 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0[0] = 0;
      if (opt->lightmode == true) {
        piVar16 = (this->super_Convolution).weight_data.refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            pvVar17 = (this->super_Convolution).weight_data.data;
            pAVar18 = (this->super_Convolution).weight_data.allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar17 != (void *)0x0) {
                free(pvVar17);
              }
            }
            else {
              (*pAVar18->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&local_108->refcount + 4) = (undefined1  [16])0x0;
        local_108->data = (void *)0x0;
        local_108->refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
        return 0;
      }
      return 0;
    }
    local_348 = CONCAT44(local_348._4_4_,iVar68) ^ 1;
    uVar69 = uVar49 ^ 3;
    uVar55 = uVar66 ^ 3;
    uVar50 = uVar7 ^ 1;
    local_378 = uVar8 ^ 1;
    local_350 = CONCAT44(local_350._4_4_,iVar65) ^ 1;
    if (((((uVar43 == 0x10 && iVar68 == 1) && uVar69 == 0) && (uVar50 == 0 && uVar55 == 0)) &&
        ((uVar9 ^ 1) == 0 && (uVar8 ^ 1) == 0)) && iVar65 == 1) {
LAB_00180bdc:
      convolution_transform_kernel_packed_sse
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar59,uVar56,uVar49,
                 uVar66,uVar43,iVar68);
    }
    else {
      local_358 = CONCAT71(local_358._1_7_,iVar65 == 1);
      local_290 = CONCAT71(local_290._1_7_,uVar7 == 1);
      local_330 = CONCAT44(local_330._4_4_,uVar43) ^ 8;
      local_340 = CONCAT44(local_340._4_4_,iVar68) ^ 8;
      bVar30 = uVar43 == 8 && iVar68 == 8;
      if ((iVar65 == 1 &&
           ((uVar8 == 1 && uVar9 == 1) && ((uVar66 == 3 && uVar7 == 1) && (uVar49 == 3 && bVar30))))
         || (((uVar8 == 1 && uVar9 == 1) && ((uVar66 == 2 && uVar7 == 1) && (bVar30 && uVar49 == 2))
             ) && iVar65 == 1)) goto LAB_00180bdc;
      bVar30 = ((((int)local_340 == 0 && (uVar43 ^ 1) == 0) && uVar69 == 0) &&
               (uVar50 == 0 && uVar55 == 0)) && local_378 == 0;
      if (((uVar9 == 1 && bVar30) && iVar65 == 1) || ((bVar30 && uVar9 == 2) && iVar65 == 2))
      goto LAB_00180bdc;
      if ((((((int)local_330 == 0 && (int)local_348 == 0) && uVar69 == 0) &&
           (uVar50 == 0 && uVar55 == 0)) && ((uVar9 ^ 1) == 0 && (uVar8 ^ 1) == 0)) &&
          (int)local_350 == 0) goto LAB_00180bdc;
      bVar30 = ((((uVar43 ^ 1) == 0 && iVar68 == 4) && uVar69 == 0) && (uVar50 == 0 && uVar55 == 0))
               && local_378 == 0;
      if (((uVar9 == 1 && bVar30) && iVar65 == 1) || (bVar30 && (uVar9 == 2 && iVar65 == 2)))
      goto LAB_00180bdc;
      convolution_transform_kernel_packed
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar59,uVar56,uVar49,
                 uVar66);
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar16 = (this->super_Convolution).weight_data.refcount;
    if (piVar16 == (int *)0x0) goto LAB_00180ff0;
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) goto LAB_00180ff0;
    pvVar17 = (this->super_Convolution).weight_data.data;
    pAVar18 = (this->super_Convolution).weight_data.allocator;
  }
  if (pAVar18 == (Allocator *)0x0) {
    if (pvVar17 != (void *)0x0) {
      free(pvVar17);
    }
  }
  else {
    (*pAVar18->_vptr_Allocator[3])();
  }
LAB_00180ff0:
  (this->super_Convolution).weight_data.cstep = 0;
  *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
       (undefined1  [16])0x0;
  (this->super_Convolution).weight_data.data = (void *)0x0;
  (this->super_Convolution).weight_data.refcount = (int *)0x0;
  (this->super_Convolution).weight_data.dims = 0;
  (this->super_Convolution).weight_data.w = 0;
  (this->super_Convolution).weight_data.h = 0;
  (this->super_Convolution).weight_data.d = 0;
  (this->super_Convolution).weight_data.c = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}